

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vehicle.cpp
# Opt level: O0

bool __thiscall Vehicle::is_point_on_vehicle(Vehicle *this,Point *p)

{
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_48 [8];
  shared_ptr<VehicleState> value_;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_> *__range1;
  Point *p_local;
  Vehicle *this_local;
  
  __end1 = std::__cxx11::
           list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
           begin(&this->nodes);
  value_.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::
       list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::end
                 (&this->nodes);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&value_.
                                                  super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    psVar2 = std::_List_iterator<std::shared_ptr<VehicleState>_>::operator*(&__end1);
    std::shared_ptr<VehicleState>::shared_ptr((shared_ptr<VehicleState> *)local_48,psVar2);
    peVar3 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    bVar1 = peVar3->p->id == p->id;
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    std::shared_ptr<VehicleState>::~shared_ptr((shared_ptr<VehicleState> *)local_48);
    if (bVar1) goto LAB_0013e79d;
    std::_List_iterator<std::shared_ptr<VehicleState>_>::operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_0013e79d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Vehicle::is_point_on_vehicle(Point *p) {
    for (auto value_: nodes) {
        if (value_->p->id == p->id) {
            return true;
        }
    }
    return false;
}